

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O1

void __thiscall
pele::physics::reactions::ReactorCvode::allocUserData
          (ReactorCvode *this,CVODEUserData *udata,int a_ncells)

{
  sunindextype NNZ;
  int M;
  int iVar1;
  undefined8 uVar2;
  Arena *pAVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Context *pCVar4;
  SUNMatrix p_Var5;
  sunindextype *psVar6;
  Real ****ppppRVar7;
  sunindextype ***pppsVar8;
  Real ***pppRVar9;
  sunindextype **ppsVar10;
  realtype **pprVar11;
  int **ppiVar12;
  SUNMatrix *pp_Var13;
  Real **ppRVar14;
  realtype *prVar15;
  Real *pRVar16;
  ostream *os_;
  int iVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  string solve_type_str;
  string prec_type_str;
  ParmParse ppcv;
  int HP;
  string local_250;
  string local_230;
  ParmParse local_210;
  undefined1 local_1b8 [392];
  
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"none","");
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"cvode","");
  amrex::ParmParse::ParmParse(&local_210,(string *)local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  udata->maxOrder = 2;
  amrex::ParmParse::query(&local_210,"max_order",&udata->maxOrder,0);
  amrex::ParmParse::query(&local_210,"solve_type",&local_250,0);
  udata->analytical_jacobian = 0;
  udata->solve_type = -1;
  udata->precond_type = -1;
  iVar1 = std::__cxx11::string::compare((char *)&local_250);
  if (iVar1 == 0) {
    udata->analytical_jacobian = 0;
    udata->solve_type = 0;
    goto LAB_0014d4b6;
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_250);
  if (iVar1 == 0) {
    udata->solve_type = 1;
    goto LAB_0014d4b6;
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_250);
  if (iVar1 == 0) {
    uVar2 = 0x200000001;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_250);
    if (iVar1 == 0) {
      udata->analytical_jacobian = 1;
      udata->solve_type = 3;
      pcVar18 = "solver_type sparse_direct requires the KLU library";
LAB_0014d4a1:
      amrex::Abort_host(pcVar18);
      goto LAB_0014d4b6;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_250);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_250);
      if (iVar1 == 0) {
        udata->solve_type = 5;
        goto LAB_0014d4b6;
      }
      iVar1 = std::__cxx11::string::compare((char *)&local_250);
      if (iVar1 != 0) {
        pcVar18 = 
        "Wrong solve_type. Options are: \'dense_direct\', denseAJ_direct\', \'sparse_direct\', \'custom_direct\', \'GMRES\', \'precGMRES\', \'fixed_point\'"
        ;
        goto LAB_0014d4a1;
      }
      udata->solve_type = 6;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"sparse_simplified_AJacobian","");
      iVar17 = 0;
      amrex::ParmParse::query(&local_210,"precond_type",&local_230,0);
      iVar1 = std::__cxx11::string::compare((char *)&local_230);
      if (iVar1 == 0) {
LAB_0014d91a:
        udata->precond_type = iVar17;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_230);
        if (iVar1 == 0) {
          udata->precond_type = 1;
          pcVar18 = "precond_type sparse_simplified_AJacobian requires the KLU library";
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_230);
          if (iVar1 == 0) {
            iVar17 = 2;
            goto LAB_0014d91a;
          }
          pcVar18 = 
          "Wrong precond_type. Options are: \'dense_simplified_AJacobian\', \'sparse_simplified_AJacobian\', \'custom_simplified_AJacobian\'"
          ;
        }
        amrex::Abort_host(pcVar18);
      }
      os_ = amrex::OutStream();
      amrex::Print::Print((Print *)local_1b8,os_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"\n",1);
      amrex::Print::~Print((Print *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0014d4b6;
    }
    uVar2 = 0x400000001;
  }
  udata->analytical_jacobian = (int)uVar2;
  udata->solve_type = (int)((ulong)uVar2 >> 0x20);
LAB_0014d4b6:
  uVar2 = local_1b8._0_8_;
  local_1b8._1_3_ = 0;
  local_1b8[0] = this->m_reactor_type == 2;
  local_1b8._4_4_ = SUB84(uVar2,4);
  udata->reactor_type = this->m_reactor_type;
  udata->ncells = a_ncells;
  udata->verbose =
       (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.verbose;
  pAVar3 = amrex::The_Arena();
  iVar1 = (*pAVar3->_vptr_Arena[2])(pAVar3,(long)(a_ncells * 9) << 3);
  udata->rYsrc_ext = (Real *)CONCAT44(extraout_var,iVar1);
  pAVar3 = amrex::The_Arena();
  lVar20 = (long)a_ncells * 8;
  iVar1 = (*pAVar3->_vptr_Arena[2])(pAVar3,lVar20);
  udata->rhoe_init = (Real *)CONCAT44(extraout_var_00,iVar1);
  pAVar3 = amrex::The_Arena();
  iVar1 = (*pAVar3->_vptr_Arena[2])(pAVar3,lVar20);
  udata->rhoesrc_ext = (Real *)CONCAT44(extraout_var_01,iVar1);
  pAVar3 = amrex::The_Arena();
  lVar20 = (long)a_ncells << 2;
  iVar1 = (*pAVar3->_vptr_Arena[2])(pAVar3,lVar20);
  udata->mask = (int *)CONCAT44(extraout_var_02,iVar1);
  pAVar3 = amrex::The_Arena();
  iVar1 = (*pAVar3->_vptr_Arena[2])(pAVar3,lVar20);
  udata->FCunt = (int *)CONCAT44(extraout_var_03,iVar1);
  udata->FirstTimePrecond = true;
  if (udata->solve_type == 4) {
    SPARSITY_INFO_SYST(&udata->NNZ,(int *)local_1b8,udata->ncells);
    iVar1 = udata->ncells;
    iVar17 = udata->NNZ;
    pCVar4 = amrex::sundials::The_Sundials_Context(0);
    M = iVar1 * 10;
    p_Var5 = SUNSparseMatrix(M,M,iVar17 * iVar1,1,
                             *(pCVar4->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    udata->PSc = p_Var5;
    psVar6 = SUNSparseMatrix_IndexPointers(p_Var5);
    udata->rowPtrs_c = psVar6;
    psVar6 = SUNSparseMatrix_IndexValues(udata->PSc);
    udata->colVals_c = psVar6;
    SPARSITY_PREPROC_SYST_CSR(psVar6,udata->rowPtrs_c,(int *)local_1b8,udata->ncells,0);
  }
  if (udata->precond_type == 2) {
    uVar21 = 0xffffffffffffffff;
    if (-1 < (long)udata->ncells) {
      uVar21 = (long)udata->ncells * 8;
    }
    ppiVar12 = (int **)operator_new__(uVar21);
    udata->colVals = ppiVar12;
    ppiVar12 = (int **)operator_new__(uVar21);
    udata->rowPtrs = ppiVar12;
    pp_Var13 = (SUNMatrix *)operator_new__(uVar21);
    udata->PS = pp_Var13;
    ppRVar14 = (Real **)operator_new__(uVar21);
    udata->JSPSmat = ppRVar14;
    SPARSITY_INFO_SYST_SIMPLIFIED(&udata->NNZ,(int *)local_1b8);
    if (0 < udata->ncells) {
      lVar20 = 0;
      do {
        NNZ = udata->NNZ;
        pCVar4 = amrex::sundials::The_Sundials_Context(0);
        p_Var5 = SUNSparseMatrix(10,10,NNZ,1,
                                 *(pCVar4->sunctx_)._M_t.
                                  super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                                  .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
        udata->PS[lVar20] = p_Var5;
        psVar6 = SUNSparseMatrix_IndexPointers(udata->PS[lVar20]);
        udata->rowPtrs[lVar20] = psVar6;
        psVar6 = SUNSparseMatrix_IndexValues(udata->PS[lVar20]);
        udata->colVals[lVar20] = psVar6;
        prVar15 = SUNSparseMatrix_Data(udata->PS[lVar20]);
        udata->Jdata[lVar20] = prVar15;
        SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR
                  (udata->colVals[lVar20],udata->rowPtrs[lVar20],(int *)local_1b8,0);
        pRVar16 = (Real *)operator_new__(800);
        udata->JSPSmat[lVar20] = pRVar16;
        lVar20 = lVar20 + 1;
      } while (lVar20 < udata->ncells);
    }
  }
  else if (udata->precond_type == 0) {
    iVar1 = udata->ncells;
    lVar20 = (long)iVar1;
    uVar21 = 0xffffffffffffffff;
    if (-1 < lVar20) {
      uVar21 = lVar20 * 8;
    }
    ppppRVar7 = (Real ****)operator_new__(uVar21);
    udata->P = ppppRVar7;
    ppppRVar7 = (Real ****)operator_new__(uVar21);
    udata->Jbd = ppppRVar7;
    pppsVar8 = (sunindextype ***)operator_new__(uVar21);
    udata->pivot = pppsVar8;
    if (0 < iVar1) {
      lVar19 = 0;
      do {
        pppRVar9 = (Real ***)operator_new__(uVar21);
        udata->P[lVar19] = pppRVar9;
        pppRVar9 = (Real ***)operator_new__(uVar21);
        udata->Jbd[lVar19] = pppRVar9;
        ppsVar10 = (sunindextype **)operator_new__(uVar21);
        udata->pivot[lVar19] = ppsVar10;
        lVar19 = lVar19 + 1;
      } while (lVar20 != lVar19);
    }
    if (0 < udata->ncells) {
      lVar20 = 0;
      do {
        pprVar11 = SUNDlsMat_newDenseMat(10,10);
        udata->P[lVar20][lVar20] = pprVar11;
        pprVar11 = SUNDlsMat_newDenseMat(10,10);
        udata->Jbd[lVar20][lVar20] = pprVar11;
        psVar6 = SUNDlsMat_newIndexArray(10);
        udata->pivot[lVar20][lVar20] = psVar6;
        lVar20 = lVar20 + 1;
      } while (lVar20 < udata->ncells);
    }
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
ReactorCvode::allocUserData(
  CVODEUserData* udata,
  int a_ncells
#ifdef AMREX_USE_GPU
  ,
  SUNMatrix& a_A,
  amrex::gpuStream_t stream
#endif
) const
{
  // Query options
  std::string solve_type_str = "none";
  amrex::ParmParse ppcv("cvode");
  udata->maxOrder = 2;
  ppcv.query("max_order", udata->maxOrder);
  ppcv.query("solve_type", solve_type_str);
  // Defaults
  udata->solve_type = -1;
  udata->analytical_jacobian = 0;
  udata->precond_type = -1;

#ifdef AMREX_USE_GPU
  if (solve_type_str == "fixed_point") {
    udata->solve_type = cvode::fixedPoint;
    udata->analytical_jacobian = 0;
  } else if (solve_type_str == "sparse_direct") {
    udata->solve_type = cvode::sparseDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "custom_direct") {
    udata->solve_type = cvode::customDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "magma_direct") {
    udata->solve_type = cvode::magmaDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "GMRES") {
    udata->solve_type = cvode::GMRES;
  } else if (solve_type_str == "precGMRES") {
    udata->solve_type = cvode::precGMRES;
    std::string prec_type_str = "cuSparse_simplified_AJacobian";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "cuSparse_simplified_AJacobian") {
      udata->precond_type = cvode::sparseSimpleAJac;
    } else {
      amrex::Abort(
        "Wrong precond_type. Only option is: 'cuSparse_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'sparse_direct', 'custom_direct', "
      "'GMRES', 'precGMRES', 'fixed_point'");
  }

#else
  if (solve_type_str == "fixed_point") {
    udata->solve_type = cvode::fixedPoint;
    udata->analytical_jacobian = 0;
  } else if (solve_type_str == "dense_direct") {
    udata->solve_type = cvode::denseFDDirect;
  } else if (solve_type_str == "denseAJ_direct") {
    udata->solve_type = cvode::denseDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "sparse_direct") {
    udata->solve_type = cvode::sparseDirect;
    udata->analytical_jacobian = 1;
#ifndef PELE_USE_KLU
    amrex::Abort("solver_type sparse_direct requires the KLU library");
#endif
  } else if (solve_type_str == "custom_direct") {
    udata->solve_type = cvode::customDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "GMRES") {
    udata->solve_type = cvode::GMRES;
  } else if (solve_type_str == "precGMRES") {
    udata->solve_type = cvode::precGMRES;
    std::string prec_type_str = "sparse_simplified_AJacobian";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "dense_simplified_AJacobian") {
      udata->precond_type = cvode::denseSimpleAJac;
    } else if (prec_type_str == "sparse_simplified_AJacobian") {
      udata->precond_type = cvode::sparseSimpleAJac;
#ifndef PELE_USE_KLU
      amrex::Abort(
        "precond_type sparse_simplified_AJacobian requires the KLU library");
#endif
    } else if (prec_type_str == "custom_simplified_AJacobian") {
      udata->precond_type = cvode::customSimpleAJac;
    } else {
      amrex::Abort(
        "Wrong precond_type. Options are: 'dense_simplified_AJacobian', "
        "'sparse_simplified_AJacobian', 'custom_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'dense_direct', denseAJ_direct', "
      "'sparse_direct', 'custom_direct', 'GMRES', 'precGMRES', 'fixed_point'");
  }
#endif

  // Pass options to udata
  const int HP =
    static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
  int nspec_tot = (NUM_SPECIES)*a_ncells;
  udata->reactor_type = m_reactor_type;
  udata->ncells = a_ncells;
  udata->verbose = verbose;
#ifdef AMREX_USE_GPU
  udata->nbThreads = 32;
  udata->nbBlocks = std::max(1, a_ncells / udata->nbThreads);
  udata->stream = stream;
#endif

  // Alloc internal udata solution/forcing containers
  udata->rYsrc_ext = static_cast<amrex::Real*>(
    amrex::The_Arena()->alloc(nspec_tot * sizeof(amrex::Real)));
  udata->rhoe_init = static_cast<amrex::Real*>(
    amrex::The_Arena()->alloc(a_ncells * sizeof(amrex::Real)));
  udata->rhoesrc_ext = static_cast<amrex::Real*>(
    amrex::The_Arena()->alloc(a_ncells * sizeof(amrex::Real)));
  udata->mask =
    static_cast<int*>(amrex::The_Arena()->alloc(a_ncells * sizeof(int)));

#ifndef AMREX_USE_GPU
  udata->FCunt =
    static_cast<int*>(amrex::The_Arena()->alloc(a_ncells * sizeof(int)));
  udata->FirstTimePrecond = true;
#endif

  // Alloc internal udata Analytical Jacobian containers
#ifdef AMREX_USE_GPU
  if (udata->solve_type == cvode::sparseDirect) {
#ifdef AMREX_USE_CUDA
    SPARSITY_INFO_SYST(&(udata->NNZ), &HP, 1);
    udata->csr_row_count_h = static_cast<int*>(
      amrex::The_Pinned_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int)));
    udata->csr_col_index_h = static_cast<int*>(
      amrex::The_Pinned_Arena()->alloc(udata->NNZ * sizeof(int)));

    cusolverStatus_t cusolver_status = CUSOLVER_STATUS_SUCCESS;
    cusolver_status = cusolverSpCreate(&(udata->cusolverHandle));
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    cusolver_status = cusolverSpSetStream(udata->cusolverHandle, stream);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    cusparseStatus_t cusparse_status = CUSPARSE_STATUS_SUCCESS;
    cusparse_status = cusparseCreate(&(udata->cuSPHandle));
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status = cusparseSetStream(udata->cuSPHandle, stream);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);

    a_A = SUNMatrix_cuSparse_NewBlockCSR(
      a_ncells, (NUM_SPECIES + 1), (NUM_SPECIES + 1), udata->NNZ,
      udata->cuSPHandle, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag((void*)a_A, "SUNMatrix_cuSparse_NewBlockCSR", 0)) {
      amrex::Abort("Something went wrong while creating cuSparse_NewBlockCSR");
    }

    int retval = SUNMatrix_cuSparse_SetFixedPattern(a_A, 1);

    SPARSITY_PREPROC_SYST_CSR(
      udata->csr_col_index_h, udata->csr_row_count_h, &HP, 1, 0);
    int sunMatFlag = SUNMatrix_cuSparse_CopyToDevice(
      a_A, nullptr, udata->csr_row_count_h, udata->csr_col_index_h);
    if (sunMatFlag != SUNMAT_SUCCESS) {
      amrex::Print()
        << " Something went wrong in SUNMatrix_cuSparse_CopyToDevice \n";
    }
#else
    amrex::Abort(
      "Solver_type sparse_direct is only available with CUDA on GPU");
#endif
  } else if (udata->solve_type == cvode::customDirect) {
#ifdef AMREX_USE_CUDA
    SPARSITY_INFO_SYST(&(udata->NNZ), &HP, 1);
    udata->csr_row_count_h =
      (int*)amrex::The_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int));
    udata->csr_col_index_h =
      (int*)amrex::The_Arena()->alloc(udata->NNZ * sizeof(int));

    cusparseStatus_t cusparse_status = CUSPARSE_STATUS_SUCCESS;
    cusparse_status = cusparseCreate(&(udata->cuSPHandle));
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status = cusparseSetStream(udata->cuSPHandle, stream);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);

    a_A = SUNMatrix_cuSparse_NewBlockCSR(
      a_ncells, (NUM_SPECIES + 1), (NUM_SPECIES + 1), udata->NNZ,
      udata->cuSPHandle, *amrex::sundials::The_Sundials_Context());
    // if (utils::check_flag((void *)a_A, "SUNMatrix_cuSparse_NewBlockCSR", 0))
    // return(1);

    int retval = SUNMatrix_cuSparse_SetFixedPattern(a_A, 1);
    // if(utils::check_flag(&retval, "SUNMatrix_cuSparse_SetFixedPattern", 1))
    // return(1);

    SPARSITY_PREPROC_SYST_CSR(
      udata->csr_col_index_h, udata->csr_row_count_h, &HP, 1, 0);
#else
    amrex::Abort(
      "Solver_type custom_direct is only available with CUDA on GPU");
#endif
  } else if (udata->solve_type == cvode::magmaDirect) {
#ifdef PELE_USE_MAGMA
    a_A = SUNMatrix_MagmaDenseBlock(
      a_ncells, (NUM_SPECIES + 1), (NUM_SPECIES + 1), SUNMEMTYPE_DEVICE,
      *amrex::sundials::The_SUNMemory_Helper(), nullptr,
      *amrex::sundials::The_Sundials_Context());
#else
    amrex::Abort("Solver_type magma_direct reauires PELE_USE_MAGMA = TRUE");
#endif
  }

#else
  if (udata->solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
    // CSC matrices data -> one big matrix used for the direct solve
    udata->colPtrs = new int*[1];
    udata->rowVals = new int*[1];
    udata->Jdata = new amrex::Real*[1];

    // Number of non zero elements in ODE system
    SPARSITY_INFO(&(udata->NNZ), &HP, udata->ncells);
    // Build Sparse Matrix for direct sparse KLU solver
    (udata->PS) = new SUNMatrix[1];
    (udata->PS)[0] = SUNSparseMatrix(
      (NUM_SPECIES + 1) * udata->ncells, (NUM_SPECIES + 1) * udata->ncells,
      udata->NNZ * udata->ncells, CSC_MAT,
      *amrex::sundials::The_Sundials_Context());
    udata->colPtrs[0] =
      static_cast<int*>(SUNSparseMatrix_IndexPointers((udata->PS)[0]));
    udata->rowVals[0] =
      static_cast<int*>(SUNSparseMatrix_IndexValues((udata->PS)[0]));
    udata->Jdata[0] = SUNSparseMatrix_Data((udata->PS)[0]);
    SPARSITY_PREPROC_CSC(
      udata->rowVals[0], udata->colPtrs[0], &HP, udata->ncells);
#endif
  } else if (udata->solve_type == cvode::customDirect) {
    // Number of non zero elements in ODE system
    SPARSITY_INFO_SYST(&(udata->NNZ), &HP, udata->ncells);
    // Build the SUNmatrix as CSR sparse and fill ptrs to row/Vals
    udata->PSc = SUNSparseMatrix(
      (NUM_SPECIES + 1) * udata->ncells, (NUM_SPECIES + 1) * udata->ncells,
      udata->NNZ * udata->ncells, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    udata->rowPtrs_c =
      static_cast<int*>(SUNSparseMatrix_IndexPointers(udata->PSc));
    udata->colVals_c =
      static_cast<int*>(SUNSparseMatrix_IndexValues(udata->PSc));
    SPARSITY_PREPROC_SYST_CSR(
      udata->colVals_c, udata->rowPtrs_c, &HP, udata->ncells, 0);
  }
#endif

  // Alloc internal udata Preconditioner containers
#ifdef AMREX_USE_GPU
  if (udata->precond_type == cvode::sparseSimpleAJac) {
#ifdef AMREX_USE_CUDA
    SPARSITY_INFO_SYST_SIMPLIFIED(&(udata->NNZ), &HP);
    udata->csr_row_count_h =
      (int*)amrex::The_Pinned_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int));
    udata->csr_col_index_h =
      (int*)amrex::The_Pinned_Arena()->alloc(udata->NNZ * sizeof(int));

    udata->csr_row_count_d =
      (int*)amrex::The_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int));
    udata->csr_col_index_d =
      (int*)amrex::The_Arena()->alloc(udata->NNZ * sizeof(int));
    udata->csr_jac_d = (amrex::Real*)amrex::The_Arena()->alloc(
      udata->NNZ * a_ncells * sizeof(amrex::Real));
    udata->csr_val_d = (amrex::Real*)amrex::The_Arena()->alloc(
      udata->NNZ * a_ncells * sizeof(amrex::Real));

    SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(
      udata->csr_col_index_h, udata->csr_row_count_h, &HP, 1);

    amrex::Gpu::htod_memcpy(
      &udata->csr_col_index_d, &udata->csr_col_index_h,
      sizeof(udata->NNZ * sizeof(int)));
    amrex::Gpu::htod_memcpy(
      &udata->csr_row_count_d, &udata->csr_row_count_h,
      sizeof((NUM_SPECIES + 2) * sizeof(int)));

    size_t workspaceInBytes = 0;
    size_t internalDataInBytes = 0;

    cusolverStatus_t cusolver_status = CUSOLVER_STATUS_SUCCESS;
    cusolver_status = cusolverSpCreate(&(udata->cusolverHandle));
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    cusolver_status = cusolverSpSetStream(udata->cusolverHandle, stream);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    cusparseStatus_t cusparse_status = CUSPARSE_STATUS_SUCCESS;
    cusparse_status = cusparseCreateMatDescr(&(udata->descrA));
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status =
      cusparseSetMatType(udata->descrA, CUSPARSE_MATRIX_TYPE_GENERAL);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status =
      cusparseSetMatIndexBase(udata->descrA, CUSPARSE_INDEX_BASE_ONE);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusolver_status = cusolverSpCreateCsrqrInfo(&(udata->info));
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    // symbolic analysis
    cusolver_status = cusolverSpXcsrqrAnalysisBatched(
      udata->cusolverHandle,
      NUM_SPECIES + 1, // size per subsystem
      NUM_SPECIES + 1, // size per subsystem
      udata->NNZ, udata->descrA, udata->csr_row_count_h, udata->csr_col_index_h,
      udata->info);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    /*
    size_t free_mem = 0;
    size_t total_mem = 0;
    cudaStat1 = cudaMemGetInfo( &free_mem, &total_mem );
    AMREX_ASSERT( cudaSuccess == cudaStat1 );
    std::cout<<"(AFTER SA) Free: "<< free_mem<< " Tot: "<<total_mem<<std::endl;
    */

    // allocate working space
    cusolver_status = cusolverSpDcsrqrBufferInfoBatched(
      udata->cusolverHandle,
      NUM_SPECIES + 1, // size per subsystem
      NUM_SPECIES + 1, // size per subsystem
      udata->NNZ, udata->descrA, udata->csr_val_d, udata->csr_row_count_h,
      udata->csr_col_index_h, a_ncells, udata->info, &internalDataInBytes,
      &workspaceInBytes);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    // amrex::Print() << " BufferInfo workspaceInBytes " << workspaceInBytes <<
    // "\n";

    cudaError_t cudaStat1 = cudaSuccess;
    cudaStat1 = cudaMalloc((void**)&(udata->buffer_qr), workspaceInBytes);
    AMREX_ASSERT(cudaStat1 == cudaSuccess);
#else
    amrex::Abort(
      "cuSparse_simplified_AJacobian is only available with CUDA on GPU");
#endif
  }

#else
  if (udata->precond_type == cvode::denseSimpleAJac) {
    // Matrix data : big bunch of dimensions, not sure why. Generally ncells ==
    // 1 so not too bad Simply create the space.
    (udata->P) = new amrex::Real***[udata->ncells];
    (udata->Jbd) = new amrex::Real***[udata->ncells];
    (udata->pivot) = new sunindextype**[udata->ncells];
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->P)[i] = new amrex::Real**[udata->ncells];
      (udata->Jbd)[i] = new amrex::Real**[udata->ncells];
      (udata->pivot)[i] = new sunindextype*[udata->ncells];
    }
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->P)[i][i] =
        SUNDlsMat_newDenseMat(NUM_SPECIES + 1, NUM_SPECIES + 1);
      (udata->Jbd)[i][i] =
        SUNDlsMat_newDenseMat(NUM_SPECIES + 1, NUM_SPECIES + 1);
      (udata->pivot)[i][i] = SUNDlsMat_newIndexArray(NUM_SPECIES + 1);
    }
  } else if (udata->precond_type == cvode::sparseSimpleAJac) {
#ifdef PELE_USE_KLU
    // CSC matrices data for each submatrix (cells)
    udata->colPtrs = new int*[udata->ncells];
    udata->rowVals = new int*[udata->ncells];
    udata->Jdata = new amrex::Real*[udata->ncells];

    // KLU internal storage
    udata->Common = new klu_common[udata->ncells];
    udata->Symbolic = new klu_symbolic*[udata->ncells];
    udata->Numeric = new klu_numeric*[udata->ncells];
    // Sparse Matrices for It Sparse KLU block-solve
    udata->PS = new SUNMatrix[udata->ncells];
    // Number of non zero elements
    SPARSITY_INFO_SYST_SIMPLIFIED(&(udata->NNZ), &HP);
    // Not used yet. TODO use to fetch sparse Mat
    udata->indx = new int[udata->NNZ];
    udata->JSPSmat = new amrex::Real*[udata->ncells];
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->PS)[i] = SUNSparseMatrix(
        NUM_SPECIES + 1, NUM_SPECIES + 1, udata->NNZ, CSC_MAT,
        *amrex::sundials::The_Sundials_Context());
      udata->colPtrs[i] = (int*)SUNSparseMatrix_IndexPointers((udata->PS)[i]);
      udata->rowVals[i] = (int*)SUNSparseMatrix_IndexValues((udata->PS)[i]);
      udata->Jdata[i] = SUNSparseMatrix_Data((udata->PS)[i]);
      // indx not used YET
      SPARSITY_PREPROC_SYST_SIMPLIFIED_CSC(
        udata->rowVals[i], udata->colPtrs[i], udata->indx, &HP);
      udata->JSPSmat[i] =
        new amrex::Real[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)];
      klu_defaults(&(udata->Common[i]));
      // udata->Common.btf = 0;
      //(udata->Common[i]).maxwork = 15;
      // udata->Common.ordering = 1;
      udata->Symbolic[i] = klu_analyze(
        NUM_SPECIES + 1, udata->colPtrs[i], udata->rowVals[i],
        &(udata->Common[i]));
    }
#endif
  } else if (udata->precond_type == cvode::customSimpleAJac) {
    // CSR matrices data for each submatrix (cells)
    udata->colVals = new int*[udata->ncells];
    udata->rowPtrs = new int*[udata->ncells];
    // Matrices for each sparse custom block-solve
    udata->PS = new SUNMatrix[udata->ncells];
    udata->JSPSmat = new amrex::Real*[udata->ncells];
    // Number of non zero elements
    SPARSITY_INFO_SYST_SIMPLIFIED(&(udata->NNZ), &HP);
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->PS)[i] = SUNSparseMatrix(
        NUM_SPECIES + 1, NUM_SPECIES + 1, udata->NNZ, CSR_MAT,
        *amrex::sundials::The_Sundials_Context());
      udata->rowPtrs[i] =
        static_cast<int*>(SUNSparseMatrix_IndexPointers((udata->PS)[i]));
      udata->colVals[i] =
        static_cast<int*>(SUNSparseMatrix_IndexValues((udata->PS)[i]));
      udata->Jdata[i] = SUNSparseMatrix_Data((udata->PS)[i]);
      SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(
        udata->colVals[i], udata->rowPtrs[i], &HP, 0);
      udata->JSPSmat[i] =
        new amrex::Real[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)];
    }
  }
#endif
}